

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kakuro.cc
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  istream *piVar5;
  logic_error *this;
  long lVar6;
  uint uVar7;
  char *pcVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  uint local_43c;
  int local_438;
  uint cols;
  uint uStack_42c;
  uint rows;
  uint uStack_424;
  string line;
  grid b;
  istringstream iss;
  byte abStack_398 [352];
  ifstream is;
  uint uStack_234;
  byte abStack_218 [488];
  
  b.runs_.super__Vector_base<grid::run_pair,_std::allocator<grid::run_pair>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  b.runs_.super__Vector_base<grid::run_pair,_std::allocator<grid::run_pair>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  b.cells_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  b.cells_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  b.rows_ = 0;
  b.cols_ = 0;
  b.cells_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  b.runs_.super__Vector_base<grid::run_pair,_std::allocator<grid::run_pair>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (argc != 2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"USAGE: ");
    poVar4 = std::operator<<(poVar4,*argv);
    poVar4 = std::operator<<(poVar4," INPUT-FILE");
    std::endl<char,std::char_traits<char>>(poVar4);
    local_438 = 1;
    goto LAB_001039f3;
  }
  std::
  vector<std::vector<run,_std::allocator<run>_>,_std::allocator<std::vector<run,_std::allocator<run>_>_>_>
  ::resize(&G_sum_table,0x2e);
  for (uVar7 = 0; uVar7 != 0x400; uVar7 = uVar7 + 2) {
    run::run((run *)&is,uVar7);
    std::vector<run,_std::allocator<run>_>::push_back
              (G_sum_table.
               super__Vector_base<std::vector<run,_std::allocator<run>_>,_std::allocator<std::vector<run,_std::allocator<run>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uStack_234,(run *)&is);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&is,argv[1],(allocator<char> *)&iss);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&is,
                          "-test");
  std::__cxx11::string::~string((string *)&is);
  if (bVar2) {
    local_438 = 0;
    for (lVar6 = 0; lVar6 != 0x2e; lVar6 = lVar6 + 1) {
      poVar4 = std::operator<<((ostream *)&std::cout,"SUM: ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,"==== ");
      std::endl<char,std::char_traits<char>>(poVar4);
      for (uVar7 = 0;
          (ulong)uVar7 <
          (ulong)((long)G_sum_table.
                        super__Vector_base<std::vector<run,_std::allocator<run>_>,_std::allocator<std::vector<run,_std::allocator<run>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar6].
                        super__Vector_base<run,_std::allocator<run>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)G_sum_table.
                        super__Vector_base<std::vector<run,_std::allocator<run>_>,_std::allocator<std::vector<run,_std::allocator<run>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar6].
                        super__Vector_base<run,_std::allocator<run>_>._M_impl.
                        super__Vector_impl_data._M_start >> 4); uVar7 = uVar7 + 1) {
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::operator<<(poVar4," = ");
        for (uVar9 = 0; uVar9 != 10; uVar9 = uVar9 + 1) {
          if ((G_sum_table.
               super__Vector_base<std::vector<run,_std::allocator<run>_>,_std::allocator<std::vector<run,_std::allocator<run>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar6].
               super__Vector_base<run,_std::allocator<run>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar7].set_.super__Base_bitset<1UL>._M_w >> (uVar9 & 0x3f) & 1) != 0) {
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::operator<<(poVar4," ");
          }
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    goto LAB_001039f3;
  }
  std::ifstream::ifstream(&is,argv[1],_S_in);
  if ((abStack_218[*(long *)(CONCAT44(uStack_234,_is) + -0x18)] & 5) == 0) {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&is,(string *)&line);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
      pcVar8 = "error reading the dimensions line";
LAB_0010392d:
      poVar4 = std::operator<<((ostream *)&std::cerr,pcVar8);
LAB_00103939:
      std::endl<char,std::char_traits<char>>(poVar4);
LAB_001039d4:
      std::__cxx11::string::~string((string *)&line);
      goto LAB_001039de;
    }
    std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&line,_S_in);
    piVar5 = std::istream::_M_extract<unsigned_int>((uint *)&iss);
    piVar5 = std::istream::_M_extract<unsigned_int>((uint *)piVar5);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
      pcVar8 = "invalid dimensions line";
LAB_001039b3:
      poVar4 = std::operator<<((ostream *)&std::cerr,pcVar8);
      std::endl<char,std::char_traits<char>>(poVar4);
LAB_001039c7:
      std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
      goto LAB_001039d4;
    }
    if (cols < 2 || rows < 2) {
      pcVar8 = "invalid dimensions (must be at least 2 in each direction)";
      goto LAB_001039b3;
    }
    grid::set_size(&b,rows,cols);
    std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&is,(string *)&line);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
      pcVar8 = "error reading the unfillable cells line";
      goto LAB_0010392d;
    }
    std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&line,_S_in);
    while( true ) {
      piVar5 = std::istream::_M_extract<unsigned_int>((uint *)&iss);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
      b.cells_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[local_43c] = 0xffffffff;
    }
    if ((abStack_398[*(long *)(_iss + -0x18)] & 2) == 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"invalid unfillable cells line");
      std::endl<char,std::char_traits<char>>(poVar4);
      goto LAB_001039c7;
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
    while( true ) {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&is,(string *)&line);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&line,_S_in);
      piVar5 = std::istream::_M_extract<unsigned_int>((uint *)&iss);
      piVar5 = std::istream::_M_extract<unsigned_int>((uint *)piVar5);
      piVar5 = std::istream::_M_extract<unsigned_int>((uint *)piVar5);
      piVar5 = std::istream::_M_extract<unsigned_int>((uint *)piVar5);
      piVar5 = std::istream::_M_extract<unsigned_int>((uint *)piVar5);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
        pcVar8 = "invalid input format for constraint index ";
LAB_00103c7a:
        poVar4 = std::operator<<((ostream *)&std::cerr,pcVar8);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::endl<char,std::char_traits<char>>(poVar4);
        goto LAB_001039c7;
      }
      auVar10._0_4_ = -(uint)(-0x7fffffd3 < (int)(rows ^ 0x80000000));
      auVar10._4_4_ = -(uint)(-0x7fffffd3 < (int)(uStack_424 ^ 0x80000000));
      auVar10._8_4_ = -(uint)(-0x7ffffff7 < (int)(rows ^ 0x80000000));
      auVar10._12_4_ = -(uint)(-0x7ffffff7 < (int)(uStack_424 ^ 0x80000000));
      iVar3 = movmskps((int)piVar5,auVar10);
      if (iVar3 != 0) {
        pcVar8 = "inconsistent data for constraint index ";
        goto LAB_00103c7a;
      }
      bVar2 = grid::add_run(&b,local_43c,rows,rows,DOWN);
      if (!bVar2) {
        pcVar8 = "overflowing (down?) run or misplaced constraint cell ";
        goto LAB_00103c7a;
      }
      bVar2 = grid::add_run(&b,local_43c,uStack_424,uStack_42c,RIGHT);
      if (!bVar2) {
        pcVar8 = "overflowing (right?) run or misplaced constraint cell ";
        goto LAB_00103c7a;
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
    }
    uVar7 = 0;
    pcVar8 = "uncovered cell ";
    while( true ) {
      uVar9 = (ulong)uVar7;
      if ((ulong)((long)b.cells_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)b.cells_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar9) break;
      uVar1 = b.cells_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9];
      if (uVar1 != 0xffffffff) {
        if (uVar1 == 0) {
          if ((b.runs_.super__Vector_base<grid::run_pair,_std::allocator<grid::run_pair>_>._M_impl.
               super__Vector_impl_data._M_start[uVar9].r_[0] != (run *)0x0) &&
             (b.runs_.super__Vector_base<grid::run_pair,_std::allocator<grid::run_pair>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9].r_[1] != (run *)0x0)) goto LAB_00103c54;
          pcVar8 = "incompletely covered cell ";
        }
        else if (uVar1 != 0xfffffffe) {
          this = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(this,"invalid grid initialization");
          __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        poVar4 = std::operator<<((ostream *)&std::cerr,pcVar8);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        goto LAB_00103939;
      }
LAB_00103c54:
      uVar7 = uVar7 + 1;
    }
    std::__cxx11::string::~string((string *)&line);
    local_438 = 0;
    solve(&b,0);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"can\'t open input file");
    std::endl<char,std::char_traits<char>>(poVar4);
LAB_001039de:
    local_438 = 1;
  }
  std::ifstream::~ifstream(&is);
LAB_001039f3:
  grid::~grid(&b);
  return local_438;
}

Assistant:

int main(int argc, char **argv) try {
	grid b;
	
	if(argc != 2) {
		cerr << "USAGE: " << argv[0] << " INPUT-FILE" << endl;
		return 1;
	}

	generate_sum_table();
	if(string(argv[1]) == "-test") {
		print_sum_table();
		return 0;
	}

	ifstream is(argv[1]);
	if(!is) {
		cerr << "can't open input file" << endl;
		return 1;
	}

	if(!read_data(is, b))
		return 1;
	solve(b, 0);
	return 0;
} catch(exception &e) {
	cerr << "INTERNAL ERROR: " << e.what() << endl;
	return 1;
}